

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usecase_test.cc
# Opt level: O0

int __thiscall
FileHandlePool::getAvailableResource
          (FileHandlePool *this,fdb_file_handle **dbfile,fdb_kvs_handle **db)

{
  value_type pPVar1;
  bool bVar2;
  int iVar3;
  size_type __n;
  reference ppPVar4;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  vector<PoolEntry_*,_std::allocator<PoolEntry_*>_> *in_RDI;
  PoolEntry *pe;
  memory_order in_stack_00000018;
  bool inverse;
  int index;
  
  do {
    do {
      iVar3 = rand();
      __n = (size_type)iVar3;
      std::vector<PoolEntry_*,_std::allocator<PoolEntry_*>_>::size
                ((vector<PoolEntry_*,_std::allocator<PoolEntry_*>_> *)
                 &(in_RDI->super__Vector_base<PoolEntry_*,_std::allocator<PoolEntry_*>_>)._M_impl.
                  super__Vector_impl_data._M_finish);
      ppPVar4 = std::vector<PoolEntry_*,_std::allocator<PoolEntry_*>_>::at(in_RDI,__n);
      pPVar1 = *ppPVar4;
    } while (pPVar1 == (value_type)0x0);
    bVar2 = std::atomic<bool>::compare_exchange_strong
                      ((atomic<bool> *)dbfile,(bool *)db,index._3_1_,in_stack_00000018);
  } while (!bVar2);
  *in_RSI = pPVar1->dbfile;
  *in_RDX = pPVar1->db;
  return pPVar1->index;
}

Assistant:

int getAvailableResource(fdb_file_handle **dbfile, fdb_kvs_handle **db) {
        while (true) {
            int index = rand() % pool_vector.size();
            bool inverse = true;
            PoolEntry *pe = pool_vector.at(index);
            if (pe && pe->available.compare_exchange_strong(inverse, false)) {
                *dbfile = pe->dbfile;
                *db = pe->db;
                return pe->index;
            }
        }
    }